

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O3

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::Resize
          (WeakReferenceHashTable<PrimePolicy> *this,int newSize)

{
  Type pRVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  hash_t hVar6;
  HeapAllocator *this_00;
  undefined4 *puVar7;
  RecyclerWeakReferenceBase **__s;
  ulong uVar8;
  size_t sVar9;
  RecyclerWeakReferenceBase *pRVar10;
  uint uVar11;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&RecyclerWeakReferenceBase*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff4e;
  data.filename._0_4_ = 0x137;
  data.plusSize = (long)newSize;
  this_00 = HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_60);
  sVar9 = 0xffffffffffffffff;
  if (-1 < newSize) {
    sVar9 = (long)newSize * 8;
  }
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_0038e5ec;
    *puVar7 = 0;
  }
  __s = (RecyclerWeakReferenceBase **)HeapAllocator::AllocT<false>(this_00,sVar9);
  uVar11 = 0;
  memset(__s,0,sVar9);
  if (__s == (RecyclerWeakReferenceBase **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_0038e5ec;
    *puVar7 = 0;
  }
  uVar5 = this->size;
  if (uVar5 == 0) {
    sVar9 = 0;
  }
  else {
    uVar8 = 0;
    uVar11 = 0;
    do {
      pRVar10 = this->buckets[uVar8];
      if (pRVar10 != (RecyclerWeakReferenceBase *)0x0) {
        do {
          data._32_8_ = uVar8;
          hVar6 = PrimePolicy::ModPrime
                            ((hash_t)((ulong)pRVar10->strongRef >> 4),newSize,this->modFunctionIndex
                            );
          pRVar1 = pRVar10->next;
          pRVar10->next = __s[(int)hVar6];
          __s[(int)hVar6] = pRVar10;
          uVar11 = uVar11 + 1;
          pRVar10 = pRVar1;
          uVar8 = data._32_8_;
        } while (pRVar1 != (Type)0x0);
        uVar5 = this->size;
      }
      uVar8 = uVar8 + 1;
      sVar9 = (size_t)uVar5;
    } while (uVar8 < sVar9);
  }
  DeleteArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*>
            (this->allocator,sVar9,this->buckets);
  this->size = newSize;
  this->buckets = __s;
  if (this->count != uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x14d,"(this->count == copiedEntries)","this->count == copiedEntries");
    if (!bVar3) {
LAB_0038e5ec:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
#if DEBUG
        uint copiedEntries = 0;
#endif
        RecyclerWeakReferenceBase** newBuckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, newSize);

        for (uint i=0; i < size; i++)
        {
            RecyclerWeakReferenceBase* current = buckets[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->strongRef, newSize);
                RecyclerWeakReferenceBase* next = current->next; // Cache the next pointer

                AddEntry(current, &newBuckets[targetBucket]);
#if DEBUG
                copiedEntries++;
#endif
                current = next;
            }
        }

        AllocatorDeleteArray(HeapAllocator, allocator, size, buckets);
        size = newSize;
        buckets = newBuckets;
#if DEBUG
        Assert(this->count == copiedEntries);
#endif
    }